

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_inet_socket_address.c
# Opt level: O0

void test_init_inet_socket_address_no_sock_addr(void)

{
  cio_error cVar1;
  undefined1 local_20 [4];
  cio_error err;
  cio_inet_address address;
  uint8_t ipv4_address [4];
  
  address.impl.field_1._8_4_ = 0x10113ac;
  cVar1 = cio_init_inet_address
                    ((cio_inet_address *)local_20,(uint8_t *)((long)&address.impl.field_1 + 8),4);
  UnityAssertEqualNumber
            (0,(long)cVar1,"initialization of IPv4 inet address failed!",0x42,
             UNITY_DISPLAY_STYLE_INT);
  cVar1 = cio_init_inet_socket_address((cio_socket_address *)0x0,(cio_inet_address *)local_20,0xc);
  UnityAssertEqualNumber
            (-0x16,(long)cVar1,
             "initialization of inet socket address didn\'t fail when no socket address object given!"
             ,0x45,UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_init_inet_socket_address_no_sock_addr(void)
{
	uint8_t ipv4_address[4] = {172, 19, 1, 1};
	struct cio_inet_address address;
	enum cio_error err = cio_init_inet_address(&address, ipv4_address, sizeof(ipv4_address));
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "initialization of IPv4 inet address failed!");

	err = cio_init_inet_socket_address(NULL, &address, 12);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_INVALID_ARGUMENT, err, "initialization of inet socket address didn't fail when no socket address object given!");
}